

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga.c
# Opt level: O0

void xc_gga_new(xc_func_type *func,int order,size_t np,double *rho,double *sigma,
               xc_gga_out_params *out)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  double *in_stack_000007a8;
  double *in_stack_000007b0;
  double *in_stack_000007b8;
  double *in_stack_000007c0;
  size_t in_stack_000007c8;
  xc_func_type *in_stack_000007d0;
  double *in_stack_00000810;
  double *in_stack_00000818;
  double *in_stack_00000820;
  double *in_stack_00000828;
  double *in_stack_00000830;
  double *in_stack_00000838;
  double *in_stack_00000840;
  double *in_stack_00000848;
  double *in_stack_00000850;
  double *in_stack_00000858;
  double *in_stack_00000860;
  double *in_stack_00000868;
  double *in_stack_00000870;
  double *in_stack_00000878;
  double *in_stack_00000880;
  double *in_stack_00000888;
  double *in_stack_00000890;
  double *in_stack_00000898;
  double *in_stack_000008a0;
  double *in_stack_000008a8;
  double *in_stack_000008b0;
  double *in_stack_000008b8;
  double *in_stack_000008c0;
  double *in_stack_000008c8;
  double *in_stack_000008d0;
  double *in_stack_000008d8;
  double *in_stack_000008e0;
  double *in_stack_000008e8;
  double *in_stack_000008f0;
  double *in_stack_000008f8;
  double *in_stack_00000900;
  double *in_stack_00000908;
  double *in_stack_00000910;
  double *in_stack_00000918;
  double *in_stack_00000920;
  double *in_stack_00000928;
  double *in_stack_00000930;
  double *in_stack_00000938;
  double *in_stack_00000940;
  double *in_stack_00000948;
  double *in_stack_00000950;
  double *in_stack_00000958;
  double *in_stack_00000960;
  double *in_stack_00000968;
  double *in_stack_00000970;
  double *in_stack_00000978;
  double *in_stack_00000980;
  double *in_stack_00000988;
  double *in_stack_00000990;
  double *in_stack_00000998;
  double *in_stack_000009a0;
  double *in_stack_000009a8;
  double *in_stack_000009b0;
  double *in_stack_000009b8;
  double *in_stack_000009c0;
  double *in_stack_000009c8;
  double *in_stack_000009d0;
  double *in_stack_000009d8;
  double *in_stack_000009e0;
  double *in_stack_000009e8;
  double *in_stack_000009f0;
  double *in_stack_000009f8;
  double *in_stack_00000a00;
  double *in_stack_00000a08;
  double *in_stack_00000a10;
  double *in_stack_00000a18;
  double *in_stack_00000a20;
  double *in_stack_00000a28;
  double *in_stack_00000a30;
  double *in_stack_00000a38;
  undefined8 in_stack_fffffffffffffd38;
  xc_func_info_type *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  xc_func_type *in_stack_fffffffffffffd50;
  
  xc_gga_sanity_check(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                      (xc_gga_out_params *)0x1577df);
  xc_gga_initalize(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                   (xc_gga_out_params *)in_stack_fffffffffffffd40);
  if (*(long *)(*in_RDI + 0x90) != 0) {
    if ((int)in_RDI[1] == 1) {
      if (*(long *)(*(long *)(*in_RDI + 0x90) + (long)in_ESI * 8) != 0) {
        (**(code **)(*(long *)(*in_RDI + 0x90) + (long)in_ESI * 8))
                  (in_RDI,in_RDX,in_RCX,in_R8,in_R9);
      }
    }
    else if (*(long *)(*(long *)(*in_RDI + 0x90) + 0x28 + (long)in_ESI * 8) != 0) {
      (**(code **)(*(long *)(*in_RDI + 0x90) + 0x28 + (long)in_ESI * 8))
                (in_RDI,in_RDX,in_RCX,in_R8,in_R9);
    }
  }
  if (in_RDI[3] != 0) {
    xc_mix_func(in_stack_000007d0,in_stack_000007c8,in_stack_000007c0,in_stack_000007b8,
                in_stack_000007b0,in_stack_000007a8,in_stack_00000810,in_stack_00000818,
                in_stack_00000820,in_stack_00000828,in_stack_00000830,in_stack_00000838,
                in_stack_00000840,in_stack_00000848,in_stack_00000850,in_stack_00000858,
                in_stack_00000860,in_stack_00000868,in_stack_00000870,in_stack_00000878,
                in_stack_00000880,in_stack_00000888,in_stack_00000890,in_stack_00000898,
                in_stack_000008a0,in_stack_000008a8,in_stack_000008b0,in_stack_000008b8,
                in_stack_000008c0,in_stack_000008c8,in_stack_000008d0,in_stack_000008d8,
                in_stack_000008e0,in_stack_000008e8,in_stack_000008f0,in_stack_000008f8,
                in_stack_00000900,in_stack_00000908,in_stack_00000910,in_stack_00000918,
                in_stack_00000920,in_stack_00000928,in_stack_00000930,in_stack_00000938,
                in_stack_00000940,in_stack_00000948,in_stack_00000950,in_stack_00000958,
                in_stack_00000960,in_stack_00000968,in_stack_00000970,in_stack_00000978,
                in_stack_00000980,in_stack_00000988,in_stack_00000990,in_stack_00000998,
                in_stack_000009a0,in_stack_000009a8,in_stack_000009b0,in_stack_000009b8,
                in_stack_000009c0,in_stack_000009c8,in_stack_000009d0,in_stack_000009d8,
                in_stack_000009e0,in_stack_000009e8,in_stack_000009f0,in_stack_000009f8,
                in_stack_00000a00,in_stack_00000a08,in_stack_00000a10,in_stack_00000a18,
                in_stack_00000a20,in_stack_00000a28,in_stack_00000a30,in_stack_00000a38);
  }
  return;
}

Assistant:

void xc_gga_new(const xc_func_type *func, int order, size_t np, const double *rho, const double *sigma,
            xc_gga_out_params *out)
{

  xc_gga_sanity_check(func->info, order, out);
  xc_gga_initalize(func, np, out);
  
  /* call the GGA routines */
  if(func->info->gga != NULL){
    if(func->nspin == XC_UNPOLARIZED){
      if(func->info->gga->unpol[order] != NULL)
        func->info->gga->unpol[order](func, np, rho, sigma, out);
    }else{
      if(func->info->gga->pol[order] != NULL)
        func->info->gga->pol[order](func, np, rho, sigma, out);
    }
  }

  if(func->mix_coef != NULL)
    xc_mix_func(func, np, rho, sigma, NULL, NULL, out->zk, out->vrho, out->vsigma, NULL, NULL,
                out->v2rho2, out->v2rhosigma, NULL, NULL, out->v2sigma2, NULL, NULL, NULL, NULL, NULL,
                out->v3rho3, out->v3rho2sigma, NULL, NULL, out->v3rhosigma2, NULL, NULL, NULL, NULL, NULL,
                out->v3sigma3, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                out->v4rho4, out->v4rho3sigma, NULL, NULL, out->v4rho2sigma2, NULL, NULL, NULL, NULL, NULL,
                out->v4rhosigma3, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                out->v4sigma4, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                NULL, NULL, NULL, NULL, NULL);
}